

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNull<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char *pcVar1;
  MemoryStream *pMVar2;
  char *pcVar3;
  Ch *pCVar4;
  char *pcVar5;
  char *pcVar6;
  
  pMVar2 = is->is_;
  pcVar5 = pMVar2->src_;
  pcVar3 = pMVar2->end_;
  if (pcVar5 != pcVar3) {
    pcVar5 = pcVar5 + 1;
    pMVar2->src_ = pcVar5;
  }
  pcVar6 = pcVar3;
  if ((pcVar5 != pcVar3) && (pcVar6 = pcVar5, *pcVar5 == 'u')) {
    pcVar1 = pcVar5 + 1;
    pMVar2->src_ = pcVar1;
    pcVar6 = pcVar3;
    if ((pcVar1 != pcVar3) && (pcVar6 = pcVar1, *pcVar1 == 'l')) {
      pcVar1 = pcVar5 + 2;
      pMVar2->src_ = pcVar1;
      pcVar6 = pcVar3;
      if ((pcVar1 != pcVar3) && (pcVar6 = pcVar1, *pcVar1 == 'l')) {
        pMVar2->src_ = pcVar5 + 3;
        pcVar5 = (handler->stack_).stackTop_;
        if ((long)(handler->stack_).stackEnd_ - (long)pcVar5 < 0x10) {
          internal::Stack<rapidjson::CrtAllocator>::
          Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                    (&handler->stack_,1);
          pcVar5 = (handler->stack_).stackTop_;
        }
        (handler->stack_).stackTop_ = pcVar5 + 0x10;
        pcVar5[0] = '\0';
        pcVar5[1] = '\0';
        pcVar5[2] = '\0';
        pcVar5[3] = '\0';
        pcVar5[4] = '\0';
        pcVar5[5] = '\0';
        pcVar5[6] = '\0';
        pcVar5[7] = '\0';
        pcVar5[8] = '\0';
        pcVar5[9] = '\0';
        pcVar5[10] = '\0';
        pcVar5[0xb] = '\0';
        pcVar5[0xc] = '\0';
        pcVar5[0xd] = '\0';
        pcVar5[0xe] = '\0';
        pcVar5[0xf] = '\0';
        return;
      }
    }
  }
  pCVar4 = pMVar2->begin_;
  *(undefined4 *)(this + 0x30) = 3;
  *(long *)(this + 0x38) = (long)pcVar6 - (long)pCVar4;
  return;
}

Assistant:

void ParseNull(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == 'n');
        is.Take();

        if (RAPIDJSON_LIKELY(Consume(is, 'u') && Consume(is, 'l') && Consume(is, 'l'))) {
            if (RAPIDJSON_UNLIKELY(!handler.Null()))
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
    }